

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O2

void cf2_arrstack_push(CF2_ArrStack arrstack,void *ptr)

{
  FT_Bool FVar1;
  size_t sVar2;
  
  sVar2 = arrstack->count;
  if (sVar2 == arrstack->allocated) {
    FVar1 = cf2_arrstack_setNumElements(arrstack,sVar2 + arrstack->chunk);
    if (FVar1 == '\0') {
      return;
    }
    sVar2 = arrstack->count;
  }
  memcpy((void *)(sVar2 * arrstack->sizeItem + (long)arrstack->ptr),ptr,arrstack->sizeItem);
  arrstack->count = arrstack->count + 1;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_arrstack_push( CF2_ArrStack  arrstack,
                     const void*   ptr )
  {
    FT_ASSERT( arrstack );

    if ( arrstack->count == arrstack->allocated )
    {
      /* grow the buffer by one chunk */
      if ( !cf2_arrstack_setNumElements(
             arrstack, arrstack->allocated + arrstack->chunk ) )
      {
        /* on error, ignore the push */
        return;
      }
    }

    FT_ASSERT( ptr );

    {
      size_t  offset = arrstack->count * arrstack->sizeItem;
      void*   newPtr = (FT_Byte*)arrstack->ptr + offset;


      FT_MEM_COPY( newPtr, ptr, arrstack->sizeItem );
      arrstack->count += 1;
    }
  }